

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_node * parse_unnamed_tag(nbt_type type,char *name,char **memory,size_t *length)

{
  nbt_node *__ptr;
  int *piVar1;
  char *pcVar2;
  nbt_list *pnVar3;
  nbt_byte_array nVar4;
  nbt_int_array nVar5;
  nbt_long_array nVar6;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  nbt_node *node;
  size_t *length_local;
  char **memory_local;
  char *name_local;
  nbt_type type_local;
  
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
  }
  else {
    __ptr->type = type;
    __ptr->name = name;
    switch(type) {
    case TAG_BYTE:
      if (*length == 0) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,1);
      *memory = pcVar2;
      *length = *length - 1;
      break;
    case TAG_SHORT:
      if (*length < 2) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,2);
      *memory = pcVar2;
      *length = *length - 2;
      break;
    case TAG_INT:
      if (*length < 4) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,4);
      *memory = pcVar2;
      *length = *length - 4;
      break;
    case TAG_LONG:
      if (*length < 8) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,8);
      *memory = pcVar2;
      *length = *length - 8;
      break;
    case TAG_FLOAT:
      if (*length < 4) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,4);
      *memory = pcVar2;
      *length = *length - 4;
      break;
    case TAG_DOUBLE:
      if (*length < 8) goto switchD_001020fb_default;
      pcVar2 = (char *)swapped_memscan(&__ptr->payload,*memory,8);
      *memory = pcVar2;
      *length = *length - 8;
      break;
    case TAG_BYTE_ARRAY:
      nVar4 = read_byte_array(memory,length);
      (__ptr->payload).tag_long = (int64_t)nVar4.data;
      *(ulong *)((long)&__ptr->payload + 8) = CONCAT44(uStack_3c,nVar4.length);
      break;
    case TAG_STRING:
      pcVar2 = read_string(memory,length);
      (__ptr->payload).tag_string = pcVar2;
      break;
    case TAG_LIST:
      pnVar3 = read_list(memory,length);
      (__ptr->payload).tag_list = pnVar3;
      break;
    case TAG_COMPOUND:
      pnVar3 = read_compound(memory,length);
      (__ptr->payload).tag_list = pnVar3;
      break;
    case TAG_INT_ARRAY:
      nVar5 = read_int_array(memory,length);
      (__ptr->payload).tag_long = (int64_t)nVar5.data;
      *(ulong *)((long)&__ptr->payload + 8) = CONCAT44(uStack_4c,nVar5.length);
      break;
    case TAG_LONG_ARRAY:
      nVar6 = read_long_array(memory,length);
      (__ptr->payload).tag_long = (int64_t)nVar6.data;
      *(ulong *)((long)&__ptr->payload + 8) = CONCAT44(uStack_5c,nVar6.length);
      break;
    default:
      goto switchD_001020fb_default;
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      return __ptr;
    }
  }
switchD_001020fb_default:
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    piVar1 = __errno_location();
    *piVar1 = -1;
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

static nbt_node* parse_unnamed_tag(nbt_type type, char* name, const char** memory, size_t* length)
{
    nbt_node* node;

    CHECKED_MALLOC(node, sizeof *node, goto parse_error);

    node->type = type;
    node->name = name;

#define COPY_INTO_PAYLOAD(payload_name) \
    READ_GENERIC(&node->payload.payload_name, sizeof node->payload.payload_name, swapped_memscan, goto parse_error);

    switch(type)
    {
    case TAG_BYTE:
        COPY_INTO_PAYLOAD(tag_byte);
        break;
    case TAG_SHORT:
        COPY_INTO_PAYLOAD(tag_short);
        break;
    case TAG_INT:
        COPY_INTO_PAYLOAD(tag_int);
        break;
    case TAG_LONG:
        COPY_INTO_PAYLOAD(tag_long);
        break;
    case TAG_FLOAT:
        COPY_INTO_PAYLOAD(tag_float);
        break;
    case TAG_DOUBLE:
        COPY_INTO_PAYLOAD(tag_double);
        break;
    case TAG_BYTE_ARRAY:
        node->payload.tag_byte_array = read_byte_array(memory, length);
        break;
    case TAG_INT_ARRAY:
        node->payload.tag_int_array = read_int_array(memory, length);
        break;
    case TAG_LONG_ARRAY:
        node->payload.tag_long_array = read_long_array(memory, length);
        break;
    case TAG_STRING:
        node->payload.tag_string = read_string(memory, length);
        break;
    case TAG_LIST:
        node->payload.tag_list = read_list(memory, length);
        break;
    case TAG_COMPOUND:
        node->payload.tag_compound = read_compound(memory, length);
        break;

    default:
        goto parse_error; /* Unknown node or TAG_END. Either way, we shouldn't be parsing this. */
    }

#undef COPY_INTO_PAYLOAD

    if(errno != NBT_OK) goto parse_error;

    return node;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(node);
    return NULL;
}